

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveArea.cpp
# Opt level: O2

void __thiscall CDirectiveArea::Encode(CDirectiveArea *this)

{
  undefined4 uVar1;
  CAssemblerCommand *pCVar2;
  Architecture *pAVar3;
  size_t bytes;
  _func_int **in_RCX;
  void *__buf;
  void *pvVar4;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 auVar5 [16];
  uchar buffer [64];
  
  if ((this->positionExpression).expression.
      super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pAVar3 = Architecture::current();
    in_RCX = pAVar3->_vptr_Architecture;
    (*in_RCX[3])(pAVar3);
    FileManager::seekVirtual(g_fileManager,this->position);
  }
  pCVar2 = (this->content)._M_t.
           super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
           super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
           super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
  if (pCVar2 != (CAssemblerCommand *)0x0) {
    (*pCVar2->_vptr_CAssemblerCommand[3])();
  }
  if ((this->fillExpression).expression.
      super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    if ((this->super_CAssemblerCommand).field_0x14 == '\x01') {
      FileManager::advanceMemory(g_fileManager,this->areaSize - this->contentSize);
      return;
    }
  }
  else {
    bytes = Allocations::getSubAreaUsage(this->fileID,this->position);
    if (bytes != 0) {
      FileManager::advanceMemory(g_fileManager,bytes);
    }
    uVar1 = *(undefined4 *)&this->fillValue;
    uVar8 = (undefined1)((uint)uVar1 >> 0x18);
    uVar7 = (undefined1)((uint)uVar1 >> 0x10);
    uVar6 = (undefined1)((uint)uVar1 >> 8);
    auVar5._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(uVar8,uVar8),uVar7),CONCAT14(uVar7,uVar1)) >>
                        0x20);
    auVar5[3] = uVar6;
    auVar5[2] = uVar6;
    auVar5[0] = (undefined1)uVar1;
    auVar5[1] = auVar5[0];
    auVar5._8_8_ = 0;
    auVar5 = pshuflw(auVar5,auVar5,0);
    buffer._0_4_ = auVar5._0_4_;
    buffer._4_4_ = buffer._0_4_;
    buffer._8_4_ = buffer._0_4_;
    buffer._12_4_ = buffer._0_4_;
    buffer._16_4_ = buffer._0_4_;
    buffer._20_4_ = buffer._0_4_;
    buffer._24_4_ = buffer._0_4_;
    buffer._28_4_ = buffer._0_4_;
    buffer._32_4_ = buffer._0_4_;
    buffer._36_4_ = buffer._0_4_;
    buffer._40_4_ = buffer._0_4_;
    buffer._44_4_ = buffer._0_4_;
    buffer._48_4_ = buffer._0_4_;
    buffer._52_4_ = buffer._0_4_;
    buffer._56_4_ = buffer._0_4_;
    buffer._60_4_ = buffer._0_4_;
    for (pvVar4 = (void *)(this->areaSize - (this->contentSize + bytes)); pvVar4 != (void *)0x0;
        pvVar4 = (void *)((long)pvVar4 - (long)__buf)) {
      __buf = (void *)0x40;
      if (pvVar4 < (void *)0x40) {
        __buf = pvVar4;
      }
      FileManager::write(g_fileManager,(int)buffer,__buf,(size_t)in_RCX);
    }
  }
  return;
}

Assistant:

void CDirectiveArea::Encode() const
{
	if (positionExpression.isLoaded())
	{
		Architecture::current().NextSection();
		g_fileManager->seekVirtual(position);
	}

	if (content)
		content->Encode();

	if (fillExpression.isLoaded())
	{
		int64_t subAreaUsage = Allocations::getSubAreaUsage(fileID, position);
		if (subAreaUsage != 0)
			g_fileManager->advanceMemory(subAreaUsage);

		unsigned char buffer[64];
		memset(buffer,fillValue,64);
		
		size_t writeSize = areaSize-contentSize-subAreaUsage;
		while (writeSize > 0)
		{
			size_t part = std::min<size_t>(64,writeSize);
			g_fileManager->write(buffer,part);
			writeSize -= part;
		}
	}
	else if (shared)
		g_fileManager->advanceMemory(areaSize-contentSize);
}